

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Error asmjit::v1_14::Formatter::formatTypeId(String *sb,TypeId typeId)

{
  byte bVar1;
  byte bVar2;
  byte in_SIL;
  String *in_RDI;
  uint32_t count;
  uint32_t baseSize;
  TypeId scalarType;
  uint32_t typeSize;
  char *typeName;
  bool local_cd;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  char *str;
  undefined3 in_stack_ffffffffffffff54;
  ModifyOp op;
  Error local_9c;
  undefined4 local_28;
  undefined4 local_24;
  uint local_20;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined4 *local_18;
  
  op = CONCAT13(in_SIL,in_stack_ffffffffffffff54);
  if (in_SIL == 0) {
    local_9c = String::_opString(in_RDI,op,in_stack_ffffffffffffff48,
                                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  else {
    local_1a = 0x20;
    local_1b = 100;
    local_20 = (uint)in_SIL;
    local_24 = 0x20;
    local_28 = 100;
    local_18 = &local_28;
    local_cd = local_20 < 0x20 || 100 < local_20;
    if (local_cd) {
      local_9c = String::_opString(in_RDI,op,in_stack_ffffffffffffff48,
                                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    }
    else {
      bVar1 = TypeUtils::_typeData[(ulong)in_SIL + 0x100];
      bVar2 = TypeUtils::_typeData[in_SIL];
      switch(bVar2) {
      case 0x20:
        str = "intptr";
        break;
      case 0x21:
        str = "uintptr";
        break;
      case 0x22:
        str = "int8";
        break;
      case 0x23:
        str = "uint8";
        break;
      case 0x24:
        str = "int16";
        break;
      case 0x25:
        str = "uint16";
        break;
      case 0x26:
        str = "int32";
        break;
      case 0x27:
        str = "uint32";
        break;
      case 0x28:
        str = "int64";
        break;
      case 0x29:
        str = "uint64";
        break;
      case 0x2a:
        str = "float32";
        break;
      case 0x2b:
        str = "float64";
        break;
      case 0x2c:
        str = "float80";
        break;
      case 0x2d:
        str = "mask8";
        break;
      case 0x2e:
        str = "mask16";
        break;
      case 0x2f:
        str = "mask32";
        break;
      case 0x30:
        str = "mask64";
        break;
      case 0x31:
        str = "mmx32";
        break;
      case 0x32:
        str = "mmx64";
        break;
      default:
        str = "unknown";
      }
      if ((uint)(byte)TypeUtils::_typeData[(ulong)bVar2 + 0x100] < (uint)bVar1) {
        local_9c = String::_opFormat(in_RDI,kAppend,"%sx%u",str,
                                     (ulong)((uint)bVar1 /
                                            (uint)(byte)TypeUtils::_typeData[(ulong)bVar2 + 0x100]))
        ;
      }
      else {
        local_9c = String::_opString(in_RDI,op,str,
                                     (ulong)CONCAT14(bVar1,CONCAT13(bVar2,(int3)
                                                  in_stack_ffffffffffffff40)));
      }
    }
  }
  return local_9c;
}

Assistant:

Error formatTypeId(String& sb, TypeId typeId) noexcept {
  if (typeId == TypeId::kVoid)
    return sb.append("void");

  if (!TypeUtils::isValid(typeId))
    return sb.append("unknown");

  const char* typeName = nullptr;
  uint32_t typeSize = TypeUtils::sizeOf(typeId);
  TypeId scalarType = TypeUtils::scalarOf(typeId);

  switch (scalarType) {
    case TypeId::kIntPtr : typeName = "intptr" ; break;
    case TypeId::kUIntPtr: typeName = "uintptr"; break;
    case TypeId::kInt8   : typeName = "int8"   ; break;
    case TypeId::kUInt8  : typeName = "uint8"  ; break;
    case TypeId::kInt16  : typeName = "int16"  ; break;
    case TypeId::kUInt16 : typeName = "uint16" ; break;
    case TypeId::kInt32  : typeName = "int32"  ; break;
    case TypeId::kUInt32 : typeName = "uint32" ; break;
    case TypeId::kInt64  : typeName = "int64"  ; break;
    case TypeId::kUInt64 : typeName = "uint64" ; break;
    case TypeId::kFloat32: typeName = "float32"; break;
    case TypeId::kFloat64: typeName = "float64"; break;
    case TypeId::kFloat80: typeName = "float80"; break;
    case TypeId::kMask8  : typeName = "mask8"  ; break;
    case TypeId::kMask16 : typeName = "mask16" ; break;
    case TypeId::kMask32 : typeName = "mask32" ; break;
    case TypeId::kMask64 : typeName = "mask64" ; break;
    case TypeId::kMmx32  : typeName = "mmx32"  ; break;
    case TypeId::kMmx64  : typeName = "mmx64"  ; break;

    default:
      typeName = "unknown";
      break;
  }

  uint32_t baseSize = TypeUtils::sizeOf(scalarType);
  if (typeSize > baseSize) {
    uint32_t count = typeSize / baseSize;
    return sb.appendFormat("%sx%u", typeName, unsigned(count));
  }
  else {
    return sb.append(typeName);
  }
}